

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O2

void train(void)

{
  vw *vw_obj;
  ostream *poVar1;
  size_t pass;
  long lVar2;
  string init_str;
  string local_108;
  string local_e8;
  Generator gen;
  Trie dict;
  
  load_dictionary(&dict,"phrase-table.vocab");
  std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&gen);
  Trie::build_max(&dict,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string
            ((string *)&init_str,
             "--search 29 -b 28 --quiet --search_task hook --ring_size 1024 --search_rollin learn --search_rollout none -q i: --ngram i15 --skips i5 --ngram c15 --ngram w6 --skips c3 --skips w3"
             ,(allocator *)&gen);
  std::__cxx11::string::string((string *)&local_108,(string *)&init_str);
  vw_obj = VW::initialize(&local_108,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  std::__cxx11::string::~string((string *)&local_108);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&init_str);
  std::endl<char,std::char_traits<char>>(poVar1);
  Generator::Generator(&gen,vw_obj,(Trie *)0x0);
  for (lVar2 = 1; lVar2 != 0x15; lVar2 = lVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"===== pass ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," =====");
    std::endl<char,std::char_traits<char>>(poVar1);
    run_istream(&gen,"phrase-table.tr",true,0);
    run_istream(&gen,"phrase-table.tr",false,300000);
    run_istream(&gen,"phrase-table.te",false,100000);
  }
  VW::finish(vw_obj,true);
  SearchTask<input,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~SearchTask(&gen.
                 super_SearchTask<input,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
  std::__cxx11::string::~string((string *)&init_str);
  Trie::~Trie(&dict);
  return;
}

Assistant:

void train()
{ // initialize VW as usual, but use 'hook' as the search_task
  Trie dict = load_dictionary("phrase-table.vocab");
  dict.build_max();
  //dict.print();

  string init_str("--search 29 -b 28 --quiet --search_task hook --ring_size 1024 --search_rollin learn --search_rollout none -q i: --ngram i15 --skips i5 --ngram c15 --ngram w6 --skips c3 --skips w3"); //  --search_use_passthrough_repr"); // -q si -q wi -q ci -q di  -f my_model
  vw& vw_obj = *VW::initialize(init_str);
  cerr << init_str << endl;
  Generator gen(vw_obj, nullptr); // &dict);
  for (size_t pass=1; pass<=20; pass++)
  { cerr << "===== pass " << pass << " =====" << endl;
    run_istream(gen, "phrase-table.tr", true);
    run_istream(gen, "phrase-table.tr", false, 300000);
    run_istream(gen, "phrase-table.te", false, 100000);
  }
  VW::finish(vw_obj);
}